

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_matrix_norm.c
# Opt level: O3

void __thiscall lu_matrix_norm(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  void *__s;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  iVar1 = *(int *)((long)this + 0x54);
  lVar9 = (long)iVar1;
  uVar2 = *(uint *)((long)this + 0x13c);
  lVar7 = *(long *)((long)this + 0x1d8);
  lVar5 = *(long *)((long)this + 0x1e8);
  __s = *(void **)((long)this + 0x2a0);
  if (0 < lVar9) {
    memset(__s,0,lVar9 * 8);
  }
  if ((int)uVar2 < 1) {
    dVar10 = 0.0;
  }
  else {
    dVar10 = 0.0;
    uVar6 = 0;
    do {
      iVar3 = *(int *)(lVar7 + uVar6 * 4);
      lVar8 = (long)Bbegin[iVar3];
      iVar4 = Bend[iVar3];
      dVar11 = 0.0;
      if (Bbegin[iVar3] < iVar4) {
        do {
          dVar11 = dVar11 + ABS(Bx[lVar8]);
          *(double *)((long)__s + (long)Bi[lVar8] * 8) =
               *(double *)((long)__s + (long)Bi[lVar8] * 8) + ABS(Bx[lVar8]);
          lVar8 = lVar8 + 1;
        } while (iVar4 != lVar8);
      }
      dVar12 = dVar11;
      if (dVar11 <= dVar10) {
        dVar12 = dVar10;
      }
      dVar10 = (double)(~-(ulong)NAN(dVar10) & (ulong)dVar12 | -(ulong)NAN(dVar10) & (ulong)dVar11);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
  }
  if ((int)uVar2 < iVar1) {
    lVar7 = (long)(int)uVar2;
    do {
      lVar8 = (long)*(int *)(lVar5 + lVar7 * 4);
      *(double *)((long)__s + lVar8 * 8) = *(double *)((long)__s + lVar8 * 8) + 1.0;
      if (dVar10 <= 1.0) {
        dVar10 = 1.0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  if (iVar1 < 1) {
    dVar11 = 0.0;
  }
  else {
    lVar7 = 0;
    dVar11 = 0.0;
    do {
      dVar12 = *(double *)((long)__s + lVar7 * 8);
      dVar13 = dVar12;
      if (dVar12 <= dVar11) {
        dVar13 = dVar11;
      }
      dVar11 = (double)(~-(ulong)NAN(dVar11) & (ulong)dVar13 | -(ulong)NAN(dVar11) & (ulong)dVar12);
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  *(double *)((long)this + 0x120) = dVar10;
  *(double *)((long)this + 0x128) = dVar11;
  return;
}

Assistant:

void lu_matrix_norm(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m          = this->m;
    const lu_int rank       = this->rank;
    const lu_int *pivotcol  = this->pivotcol;
    const lu_int *pivotrow  = this->pivotrow;
    double *rowsum          = this->work1;
    lu_int ipivot, jpivot, i, k, pos;
    double onenorm, infnorm, colsum;

    assert(this->nupdate == 0);

    for (i = 0; i < m; i++) rowsum[i] = 0;
    onenorm = 0;
    infnorm = 0;
    for (k = 0; k < rank; k++)
    {
        jpivot = pivotcol[k];
        colsum = 0;
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            colsum += fabs(Bx[pos]);
            rowsum[Bi[pos]] += fabs(Bx[pos]);
        }
        onenorm = fmax(onenorm, colsum);
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rowsum[ipivot] += 1;
        onenorm = fmax(onenorm, 1);
    }
    for (i = 0; i < m; i++) infnorm = fmax(infnorm, rowsum[i]);

    this->onenorm = onenorm;
    this->infnorm = infnorm;
}